

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void btLDLTAddTL(btScalar *L,btScalar *d,btScalar *a,int n,int nskip,
                btAlignedObjectArray<float> *scratch)

{
  float *pfVar1;
  float *pfVar2;
  uint in_EAX;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int p;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uStack_38;
  
  if (1 < n) {
    uStack_38 = (ulong)in_EAX;
    btAlignedObjectArray<float>::resize(scratch,nskip * 2,(float *)((long)&uStack_38 + 4));
    pfVar2 = scratch->m_data;
    *pfVar2 = 0.0;
    pfVar1 = pfVar2 + nskip;
    *pfVar1 = 0.0;
    uVar3 = (ulong)(uint)n;
    for (uVar4 = 1; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      fVar9 = a[uVar4];
      pfVar1[uVar4] = fVar9 * 0.70710677;
      pfVar2[uVar4] = fVar9 * 0.70710677;
    }
    fVar11 = (*a * 0.5 + 1.0) * 0.70710677;
    fVar15 = (*a * 0.5 + -1.0) * 0.70710677;
    fVar9 = fVar11 * fVar11 * *d + 1.0;
    fVar12 = *d / fVar9;
    fVar14 = fVar11 * fVar12 * fVar15;
    pfVar6 = L + nskip;
    for (uVar4 = 1; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      fVar10 = pfVar2[uVar4];
      fVar13 = *pfVar6;
      pfVar2[uVar4] = -fVar11 * fVar13 + fVar10;
      pfVar1[uVar4] = fVar10 * (1.0 - fVar14) + fVar13 * (fVar14 * fVar11 - fVar15);
      pfVar6 = pfVar6 + nskip;
    }
    pfVar6 = L + (long)nskip + (long)(nskip + 1);
    lVar5 = 2;
    fVar11 = -fVar15 * fVar15 * fVar12 + 1.0;
    for (uVar4 = 1; uVar4 != uVar3; uVar4 = uVar4 + 1) {
      fVar12 = pfVar2[uVar4];
      fVar14 = pfVar1[uVar4];
      fVar10 = fVar12 * fVar12 * d[uVar4] + fVar9;
      fVar13 = d[uVar4] / fVar10;
      fVar9 = fVar13 * fVar9;
      fVar15 = fVar11 - fVar14 * fVar14 * fVar9;
      fVar9 = fVar9 / fVar15;
      d[uVar4] = fVar11 * fVar9;
      pfVar7 = pfVar6;
      for (lVar8 = lVar5; (int)lVar8 < n; lVar8 = lVar8 + 1) {
        fVar11 = -fVar12 * *pfVar7 + pfVar2[lVar8];
        fVar16 = fVar12 * fVar13 * fVar11 + *pfVar7;
        pfVar2[lVar8] = fVar11;
        fVar11 = -fVar14 * fVar16 + pfVar1[lVar8];
        pfVar1[lVar8] = fVar11;
        *pfVar7 = fVar9 * -fVar14 * fVar11 + fVar16;
        pfVar7 = pfVar7 + nskip;
      }
      lVar5 = lVar5 + 1;
      pfVar6 = pfVar6 + (nskip + 1);
      fVar11 = fVar15;
      fVar9 = fVar10;
    }
  }
  return;
}

Assistant:

void btLDLTAddTL (btScalar *L, btScalar *d, const btScalar *a, int n, int nskip, btAlignedObjectArray<btScalar>& scratch)
{
  btAssert (L && d && a && n > 0 && nskip >= n);

  if (n < 2) return;
  scratch.resize(2*nskip);
  btScalar *W1 = &scratch[0];
  
  btScalar *W2 = W1 + nskip;

  W1[0] = btScalar(0.0);
  W2[0] = btScalar(0.0);
  for (int j=1; j<n; ++j) {
    W1[j] = W2[j] = (btScalar) (a[j] * SIMDSQRT12);
  }
  btScalar W11 = (btScalar) ((btScalar(0.5)*a[0]+1)*SIMDSQRT12);
  btScalar W21 = (btScalar) ((btScalar(0.5)*a[0]-1)*SIMDSQRT12);

  btScalar alpha1 = btScalar(1.0);
  btScalar alpha2 = btScalar(1.0);

  {
    btScalar dee = d[0];
    btScalar alphanew = alpha1 + (W11*W11)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = W11 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (W21*W21)*dee;
    dee /= alphanew;
    //btScalar gamma2 = W21 * dee;
    alpha2 = alphanew;
    btScalar k1 = btScalar(1.0) - W21*gamma1;
    btScalar k2 = W21*gamma1*W11 - W21;
    btScalar *ll = L + nskip;
    for (int p=1; p<n; ll+=nskip, ++p) {
      btScalar Wp = W1[p];
      btScalar ell = *ll;
      W1[p] =    Wp - W11*ell;
      W2[p] = k1*Wp +  k2*ell;
    }
  }

  btScalar *ll = L + (nskip + 1);
  for (int j=1; j<n; ll+=nskip+1, ++j) {
    btScalar k1 = W1[j];
    btScalar k2 = W2[j];

    btScalar dee = d[j];
    btScalar alphanew = alpha1 + (k1*k1)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = k1 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (k2*k2)*dee;
    dee /= alphanew;
    btScalar gamma2 = k2 * dee;
    dee *= alpha2;
    d[j] = dee;
    alpha2 = alphanew;

    btScalar *l = ll + nskip;
    for (int p=j+1; p<n; l+=nskip, ++p) {
      btScalar ell = *l;
      btScalar Wp = W1[p] - k1 * ell;
      ell += gamma1 * Wp;
      W1[p] = Wp;
      Wp = W2[p] - k2 * ell;
      ell -= gamma2 * Wp;
      W2[p] = Wp;
      *l = ell;
    }
  }
}